

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

bool __thiscall
dxil_spv::CFGStructurizer::control_flow_is_escaping_from_loop
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  CFGNode *pCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  CFGNode *this_00;
  pointer ppCVar9;
  
  if (node != merge) {
    bVar4 = CFGNode::post_dominates(merge,node);
    if (!bVar4) {
      __assert_fail("merge->post_dominates(node)",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0xbc5,
                    "bool dxil_spv::CFGStructurizer::control_flow_is_escaping_from_loop(const CFGNode *, const CFGNode *) const"
                   );
    }
    this_00 = get_innermost_loop_header_for(this,node);
    if ((this_00 != (CFGNode *)0x0) && (this_00->pred_back_edge != (CFGNode *)0x0)) {
      bVar4 = CFGNode::dominates(node,merge);
      pCVar1 = this_00->pred_back_edge;
      bVar5 = query_reachability(this,node,pCVar1);
      bVar6 = query_reachability(this,pCVar1,node);
      ppCVar2 = (node->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppCVar3 = (node->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (ppCVar9 = ppCVar3, ppCVar9 != ppCVar2) {
        pCVar1 = *ppCVar9;
        bVar7 = CFGNode::dominates(this_00,pCVar1);
        bVar8 = query_reachability(this,pCVar1,this_00->pred_back_edge);
        if ((!bVar7) || (ppCVar3 = ppCVar9 + 1, !bVar8)) break;
      }
      return (!bVar5 && (!bVar4 && !bVar6)) && ppCVar9 == ppCVar2;
    }
  }
  return false;
}

Assistant:

bool CFGStructurizer::control_flow_is_escaping_from_loop(const CFGNode *node, const CFGNode *merge) const
{
	bool escaping_path = false;

	if (node == merge)
		return escaping_path;

	assert(merge->post_dominates(node));

	// First, test the loop scenario.
	// If we're inside a loop, we're a break construct if we can prove that:
	// - node has a loop header which dominates it.
	// - node cannot reach the continue block.
	// - Continue block cannot reach node.
	// - All post-domination frontiers can reach the continue block, meaning that at some point control flow
	//   decided to break out of the loop construct.
	auto *innermost_loop_header = get_innermost_loop_header_for(node);
	if (innermost_loop_header && innermost_loop_header->pred_back_edge)
	{
		bool dominates_merge = node->dominates(merge);
		bool can_reach_continue = query_reachability(*node, *innermost_loop_header->pred_back_edge);
		bool continue_can_reach = query_reachability(*innermost_loop_header->pred_back_edge, *node);
		bool pdf_can_reach_continue = true;

		for (auto *frontier : node->post_dominance_frontier)
		{
			bool header_dominates_frontier = innermost_loop_header->dominates(frontier);
			bool frontier_is_inside_loop_construct =
				query_reachability(*frontier, *innermost_loop_header->pred_back_edge);
			if (!header_dominates_frontier || !frontier_is_inside_loop_construct)
			{
				pdf_can_reach_continue = false;
				break;
			}
		}

		if (!dominates_merge && !continue_can_reach && !can_reach_continue && pdf_can_reach_continue)
			escaping_path = true;
	}

	return escaping_path;
}